

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::Uninitialize(JavascriptLibrary *this)

{
  int iVar1;
  int iVar2;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar3;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar4;
  Type *this_00;
  SourceTextModuleRecord *this_01;
  nullptr_t local_20;
  int local_14;
  JavascriptLibrary *pJStack_10;
  int index;
  JavascriptLibrary *this_local;
  
  pJStack_10 = this;
  ppLVar3 = Memory::WriteBarrierPtr::operator_cast_to_List__
                      ((WriteBarrierPtr *)&this->moduleRecordList);
  if (*ppLVar3 !=
      (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    local_14 = 0;
    while( true ) {
      iVar1 = local_14;
      pLVar4 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->(&this->moduleRecordList);
      iVar2 = JsUtil::ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
              ::Count(&pLVar4->
                       super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                     );
      if (iVar2 <= iVar1) break;
      pLVar4 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->(&this->moduleRecordList);
      this_00 = JsUtil::
                List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(pLVar4,local_14);
      this_01 = Memory::WriteBarrierPtr<Js::SourceTextModuleRecord>::operator->(this_00);
      SourceTextModuleRecord::ReleaseParserResources(this_01);
      local_14 = local_14 + 1;
    }
  }
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::GlobalObject>::operator=
            (&(this->super_JavascriptLibraryBase).globalObject,&local_20);
  return;
}

Assistant:

void JavascriptLibrary::Uninitialize()
    {
#if DBG
        if (moduleRecordList != nullptr)
        {
            // This should mostly be a no-op except for error cases where we may not have had a chance to cleaup a module record yet.
            // Do this only in debug builds to avoid reporting of a memory leak. In release builds this doesn't matter as we will cleanup anyways.
            for (int index = 0; index < moduleRecordList->Count(); index++)
            {
                moduleRecordList->Item(index)->ReleaseParserResources();
            }
        }
#endif
        this->globalObject = nullptr;
    }